

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O2

ostream * toml::operator<<(ostream *os,time_offset *offset)

{
  ostream *poVar1;
  uint uVar2;
  
  if (offset->hour == '\0' && offset->minute == '\0') {
    std::operator<<((ostream *)os,'Z');
  }
  else {
    uVar2 = offset->hour * 0x3c + (int)offset->minute;
    if ((int)uVar2 < 0) {
      std::operator<<((ostream *)os,'-');
      uVar2 = -uVar2;
    }
    else {
      std::operator<<((ostream *)os,'+');
    }
    poVar1 = std::operator<<(os,0x30);
    *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uVar2 & 0xffff) / 0x3c);
    std::operator<<(poVar1,':');
    poVar1 = std::operator<<(os,0x30);
    *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 2;
    std::ostream::operator<<(poVar1,(uVar2 & 0xffff) % 0x3c);
  }
  return os;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const time_offset& offset)
{
    if(offset.hour == 0 && offset.minute == 0)
    {
        os << 'Z';
        return os;
    }
    int minute = static_cast<int>(offset.hour) * 60 + offset.minute;
    if(minute < 0){os << '-'; minute = std::abs(minute);} else {os << '+';}
    os << std::setfill('0') << std::setw(2) << minute / 60 << ':';
    os << std::setfill('0') << std::setw(2) << minute % 60;
    return os;
}